

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

MODIFIED_HANDLE modified_clone(MODIFIED_HANDLE value)

{
  AMQP_VALUE pAVar1;
  MODIFIED_HANDLE local_18;
  MODIFIED_INSTANCE *modified_instance;
  MODIFIED_HANDLE value_local;
  
  local_18 = (MODIFIED_HANDLE)malloc(8);
  if (local_18 != (MODIFIED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (MODIFIED_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

MODIFIED_HANDLE modified_clone(MODIFIED_HANDLE value)
{
    MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)malloc(sizeof(MODIFIED_INSTANCE));
    if (modified_instance != NULL)
    {
        modified_instance->composite_value = amqpvalue_clone(((MODIFIED_INSTANCE*)value)->composite_value);
        if (modified_instance->composite_value == NULL)
        {
            free(modified_instance);
            modified_instance = NULL;
        }
    }

    return modified_instance;
}